

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::fixIoArraySize(TParseContext *this,TSourceLoc *loc,TType *type)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TType *type_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  uVar2 = (*type->_vptr_TType[0x1d])();
  if ((((uVar2 & 1) != 0) &&
      (iVar3 = (*type->_vptr_TType[10])(),
      (*(ulong *)(CONCAT44(extraout_var,iVar3) + 8) >> 0x2c & 1) == 0)) &&
     (bVar1 = TSymbolTable::atBuiltInLevel((this->super_TParseContextBase).symbolTable), !bVar1)) {
    bVar1 = isIoResizeArray(this,type);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("! isIoResizeArray(type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x2e6,
                    "void glslang::TParseContext::fixIoArraySize(const TSourceLoc &, TType &)");
    }
    iVar3 = (*type->_vptr_TType[10])();
    if ((((((uint)*(undefined8 *)(CONCAT44(extraout_var_00,iVar3) + 8) & 0x7f) == 3) &&
         (iVar3 = (*type->_vptr_TType[10])(),
         (*(ulong *)(CONCAT44(extraout_var_01,iVar3) + 8) >> 0x2c & 1) == 0)) &&
        (((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl ||
         ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation))))
       && (iVar3 = (*type->_vptr_TType[0xf])(), iVar3 != (this->resources).maxPatchVertices)) {
      uVar2 = (*type->_vptr_TType[0x1e])();
      if ((uVar2 & 1) != 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "tessellation input array size must be gl_MaxPatchVertices or implicitly sized",
                   "[]","");
      }
      TType::changeOuterArraySize(type,(this->resources).maxPatchVertices);
    }
  }
  return;
}

Assistant:

void TParseContext::fixIoArraySize(const TSourceLoc& loc, TType& type)
{
    if (! type.isArray() || type.getQualifier().patch || symbolTable.atBuiltInLevel())
        return;

    assert(! isIoResizeArray(type));

    if (type.getQualifier().storage != EvqVaryingIn || type.getQualifier().patch)
        return;

    if (language == EShLangTessControl || language == EShLangTessEvaluation) {
        if (type.getOuterArraySize() != resources.maxPatchVertices) {
            if (type.isSizedArray())
                error(loc, "tessellation input array size must be gl_MaxPatchVertices or implicitly sized", "[]", "");
            type.changeOuterArraySize(resources.maxPatchVertices);
        }
    }
}